

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvectorst.hpp
# Opt level: O1

void __thiscall
soplex::
SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *base)

{
  pointer pnVar1;
  undefined8 uVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  cpp_dec_float<200u,int,void> *pcVar15;
  undefined4 *puVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  uint *puVar20;
  undefined4 *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar23;
  byte bVar24;
  Real a;
  cpp_dec_float<200U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  undefined1 local_688 [16];
  undefined1 local_678 [16];
  undefined1 local_668 [13];
  undefined3 uStack_65b;
  int iStack_658;
  bool bStack_654;
  long local_650;
  SPxVectorST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  int local_63c;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined1 local_618 [16];
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [13];
  undefined3 uStack_5cb;
  int iStack_5c8;
  bool bStack_5c4;
  undefined8 local_5c0;
  long local_5b8;
  undefined8 uStack_5b0;
  long local_5a8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5a0;
  undefined1 local_598 [32];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [13];
  undefined3 uStack_52b;
  int iStack_528;
  bool bStack_524;
  long local_520;
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [13];
  undefined3 uStack_4ab;
  int iStack_4a8;
  bool bStack_4a4;
  long local_4a0;
  undefined1 local_498 [32];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [13];
  undefined3 uStack_42b;
  int iStack_428;
  bool bStack_424;
  undefined8 local_420;
  undefined1 local_418 [32];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [13];
  undefined3 uStack_3ab;
  int iStack_3a8;
  bool bStack_3a4;
  long local_3a0;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [13];
  undefined3 uStack_32b;
  int iStack_328;
  bool bStack_324;
  undefined8 local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  uint local_2b8 [3];
  undefined3 uStack_2ab;
  int iStack_2a8;
  bool bStack_2a4;
  undefined8 local_2a0;
  cpp_dec_float<200U,_int,_void> local_298;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [13];
  undefined3 uStack_1ab;
  int iStack_1a8;
  bool bStack_1a4;
  undefined8 local_1a0;
  cpp_dec_float<200U,_int,_void> local_18c;
  undefined4 local_10c [27];
  uint local_a0 [28];
  
  bVar24 = 0;
  local_5a0 = base;
  local_648 = this;
  if (this->state == DVEC) {
    iVar8 = (base->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    lVar11 = (long)iVar8;
    if (iVar8 != (int)((ulong)((long)(this->vec).val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->vec).val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 7))
    goto LAB_005a7072;
    local_5c0._0_4_ = cpp_dec_float_finite;
    local_5c0._4_4_ = 0x1c;
    local_638 = (undefined1  [16])0x0;
    local_628 = (undefined1  [16])0x0;
    local_618 = (undefined1  [16])0x0;
    local_608 = (undefined1  [16])0x0;
    local_5f8 = (undefined1  [16])0x0;
    local_5e8 = (undefined1  [16])0x0;
    local_5d8 = SUB1613((undefined1  [16])0x0,0);
    uStack_5cb = 0;
    iStack_5c8 = 0;
    bStack_5c4 = false;
    local_2a0._0_4_ = cpp_dec_float_finite;
    local_2a0._4_4_ = 0x1c;
    local_318 = (undefined1  [16])0x0;
    local_308 = (undefined1  [16])0x0;
    local_2f8 = (undefined1  [16])0x0;
    local_2e8 = (undefined1  [16])0x0;
    local_2d8 = (undefined1  [16])0x0;
    local_2c8 = (undefined1  [16])0x0;
    local_2b8[0] = 0;
    local_2b8[1] = 0;
    stack0xfffffffffffffd50 = 0;
    uStack_2ab = 0;
    iStack_2a8 = 0;
    bStack_2a4 = false;
    local_420._0_4_ = cpp_dec_float_finite;
    local_420._4_4_ = 0x1c;
    local_498._0_16_ = (undefined1  [16])0x0;
    local_498._16_16_ = (undefined1  [16])0x0;
    local_478 = (undefined1  [16])0x0;
    local_468 = (undefined1  [16])0x0;
    local_458 = (undefined1  [16])0x0;
    local_448 = (undefined1  [16])0x0;
    local_438 = SUB1613((undefined1  [16])0x0,0);
    uStack_42b = 0;
    iStack_428 = 0;
    bStack_424 = false;
    if (iVar8 != 0) {
      lVar9 = lVar11 << 7;
      do {
        pnVar1 = (this->vec).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar18 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar9);
        puVar20 = local_a0;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar20 = *puVar18;
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          puVar20 = puVar20 + (ulong)bVar24 * -2 + 1;
        }
        iVar8 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70);
        bVar14 = *(byte *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74);
        uVar2 = *(undefined8 *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78);
        local_650._0_4_ = cpp_dec_float_finite;
        local_650._4_4_ = 0x1c;
        bStack_654 = false;
        iStack_658 = 0;
        puVar18 = local_a0;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar10->data)._M_elems[0] = *puVar18;
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
        }
        bStack_654 = (bool)bVar14;
        if ((bVar14 == 1) && ((fpclass_type)uVar2 != cpp_dec_float_finite || local_6c8._0_4_ != 0))
        {
          bStack_654 = false;
        }
        lVar11 = lVar11 + -1;
        iStack_658 = iVar8;
        local_650 = uVar2;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)&(this->
                           super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).rowWeight.data.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9),
                   (cpp_dec_float<200U,_int,_void> *)local_6c8);
        lVar9 = lVar9 + -0x80;
      } while (lVar11 != 0);
    }
    lVar11 = (long)(local_5a0->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar11 != 0) {
      pSVar23 = local_5a0;
      do {
        pIVar3 = (pSVar23->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem;
        iVar8 = (pSVar23->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[lVar11 + -1].idx;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)local_498,0);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_498;
        puVar18 = (uint *)local_318;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        }
        iStack_2a8 = iStack_428;
        bStack_2a4 = bStack_424;
        local_2a0._0_4_ = (fpclass_type)local_420;
        local_2a0._4_4_ = local_420._4_4_;
        lVar9 = (long)pIVar3[iVar8].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused;
        if (lVar9 != 0) {
          pIVar3 = pIVar3 + iVar8;
          lVar12 = lVar9 * 0x84;
          do {
            pNVar4 = (pIVar3->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            puVar18 = (uint *)((long)&pNVar4[-1].val.m_backend.data + lVar12);
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_638;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar10->data)._M_elems[0] = *puVar18;
              puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            }
            iStack_5c8 = *(int *)((long)&(pNVar4->val).m_backend.data + lVar12 + -0x14);
            bStack_5c4 = *(bool *)((long)&(pNVar4->val).m_backend.data + lVar12 + -0x10);
            local_5c0 = *(undefined8 *)((long)&(pNVar4->val).m_backend.data + lVar12 + -0xc);
            pcVar10 = &(local_648->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)&(((pIVar3->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val).m_backend.data + lVar12 + -4)].m_backend;
            local_650._0_4_ = cpp_dec_float_finite;
            local_650._4_4_ = 0x1c;
            local_6c8 = (undefined1  [16])0x0;
            local_6b8 = (undefined1  [16])0x0;
            local_6a8 = (undefined1  [16])0x0;
            local_698 = (undefined1  [16])0x0;
            local_688 = (undefined1  [16])0x0;
            local_678 = (undefined1  [16])0x0;
            local_668 = SUB1613((undefined1  [16])0x0,0);
            uStack_65b = 0;
            iStack_658 = 0;
            bStack_654 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_6c8 != pcVar10) {
              pcVar17 = pcVar10;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4)
                ;
              }
              iStack_658 = pcVar10->exp;
              bStack_654 = pcVar10->neg;
              local_650._0_4_ = pcVar10->fpclass;
              local_650._4_4_ = pcVar10->prec_elem;
            }
            lVar9 = lVar9 + -1;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                       (cpp_dec_float<200U,_int,_void> *)local_638);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_318,
                       (cpp_dec_float<200U,_int,_void> *)local_6c8);
            local_650._0_4_ = cpp_dec_float_finite;
            local_650._4_4_ = 0x1c;
            bStack_654 = false;
            iStack_658 = 0;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_638;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
            for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            }
            iStack_658 = iStack_5c8;
            bStack_654 = bStack_5c4;
            local_650._0_4_ = (fpclass_type)local_5c0;
            local_650._4_4_ = local_5c0._4_4_;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                       (cpp_dec_float<200U,_int,_void> *)local_638);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_498,
                       (cpp_dec_float<200U,_int,_void> *)local_6c8);
            lVar12 = lVar12 + -0x84;
          } while (lVar9 != 0);
        }
        pSVar23 = local_5a0;
        lVar11 = lVar11 + -1;
        if ((fpclass_type)local_420 != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,0,(type *)0x0);
          iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_498,
                             (cpp_dec_float<200U,_int,_void> *)local_6c8);
          if (0 < iVar8) {
            local_520._0_4_ = cpp_dec_float_finite;
            local_520._4_4_ = 0x1c;
            local_598._0_16_ = (undefined1  [16])0x0;
            local_598._16_16_ = (undefined1  [16])0x0;
            local_578 = (undefined1  [16])0x0;
            local_568 = (undefined1  [16])0x0;
            local_558 = (undefined1  [16])0x0;
            local_548 = (undefined1  [16])0x0;
            local_538 = SUB1613((undefined1  [16])0x0,0);
            uStack_52b = 0;
            iStack_528 = 0;
            bStack_524 = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      ((cpp_dec_float<200U,_int,_void> *)local_598,
                       (cpp_dec_float<200U,_int,_void> *)local_318,
                       (cpp_dec_float<200U,_int,_void> *)local_498);
            pcVar10 = &(pSVar23->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
            local_1a0._0_4_ = cpp_dec_float_finite;
            local_1a0._4_4_ = 0x1c;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            local_1b8 = SUB1613((undefined1  [16])0x0,0);
            uStack_1ab = 0;
            iStack_1a8 = 0;
            bStack_1a4 = false;
            if ((cpp_dec_float<200U,_int,_void> *)local_218 == pcVar10) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_218,
                         (cpp_dec_float<200U,_int,_void> *)local_598);
              if (local_218._0_4_ != 0 || (fpclass_type)local_1a0 != cpp_dec_float_finite) {
                bStack_1a4 = (bool)(bStack_1a4 ^ 1);
              }
            }
            else {
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_598;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_218;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pcVar19->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4)
                ;
              }
              iStack_1a8 = iStack_528;
              bStack_1a4 = bStack_524;
              local_1a0._0_4_ = (fpclass_type)local_520;
              local_1a0._4_4_ = local_520._4_4_;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_218,pcVar10);
            }
            local_650._0_4_ = cpp_dec_float_finite;
            local_650._4_4_ = 0x1c;
            bStack_654 = false;
            iStack_658 = 0;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_218;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            }
            iStack_658 = iStack_1a8;
            bStack_654 = bStack_1a4;
            local_650._0_4_ = (fpclass_type)local_1a0;
            local_650._4_4_ = local_1a0._4_4_;
            if ((bStack_1a4 == true) &&
               ((fpclass_type)local_1a0 != cpp_dec_float_finite || local_6c8._0_4_ != 0)) {
              bStack_654 = false;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      (&(local_648->
                        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).colWeight.data.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend,
                       (cpp_dec_float<200U,_int,_void> *)local_6c8);
          }
        }
      } while (lVar11 != 0);
    }
  }
  else {
    if ((this->state != PVEC) ||
       ((base->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum !=
        (int)((ulong)((long)(this->vec).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->vec).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 7))) {
LAB_005a7072:
      SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setupWeights(&this->
                      super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,base);
      return;
    }
    a = Tolerances::epsilon((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_2a0._0_4_ = cpp_dec_float_finite;
    local_2a0._4_4_ = 0x1c;
    local_318 = ZEXT816(0);
    local_308 = ZEXT816(0);
    local_2f8 = ZEXT816(0);
    local_2e8 = ZEXT816(0);
    local_2d8 = ZEXT816(0);
    local_2c8 = ZEXT816(0);
    local_2b8[0] = 0;
    local_2b8[1] = 0;
    stack0xfffffffffffffd50 = 0;
    uStack_2ab = 0;
    iStack_2a8 = 0;
    bStack_2a4 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_318,a);
    local_420._0_4_ = cpp_dec_float_finite;
    local_420._4_4_ = 0x1c;
    local_498._0_16_ = (undefined1  [16])0x0;
    local_498._16_16_ = (undefined1  [16])0x0;
    local_478 = (undefined1  [16])0x0;
    local_468 = (undefined1  [16])0x0;
    local_458 = (undefined1  [16])0x0;
    local_448 = (undefined1  [16])0x0;
    local_438 = SUB1613((undefined1  [16])0x0,0);
    uStack_42b = 0;
    iStack_428 = 0;
    bStack_424 = false;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<200U,_int,_void> *)local_6c8,10000,(type *)0x0);
    pcVar15 = (cpp_dec_float<200u,int,void> *)local_318;
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_498;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar10->data)._M_elems[0] = *(uint *)pcVar15;
      pcVar15 = pcVar15 + (ulong)bVar24 * -8 + 4;
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
    }
    iStack_428 = iStack_2a8;
    bStack_424 = bStack_2a4;
    local_420._0_4_ = (fpclass_type)local_2a0;
    local_420._4_4_ = local_2a0._4_4_;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              ((cpp_dec_float<200U,_int,_void> *)local_498,
               (cpp_dec_float<200U,_int,_void> *)local_6c8);
    local_520 = 0x1c00000000;
    local_598._0_16_ = (undefined1  [16])0x0;
    local_598._16_16_ = (undefined1  [16])0x0;
    local_578 = (undefined1  [16])0x0;
    local_568 = (undefined1  [16])0x0;
    local_558 = (undefined1  [16])0x0;
    local_548 = (undefined1  [16])0x0;
    local_538 = SUB1613((undefined1  [16])0x0,0);
    uStack_52b = 0;
    iStack_528 = 0;
    bStack_524 = false;
    local_3a0 = 0x1c00000000;
    local_418._0_16_ = (undefined1  [16])0x0;
    local_418._16_16_ = (undefined1  [16])0x0;
    local_3f8 = (undefined1  [16])0x0;
    local_3e8 = (undefined1  [16])0x0;
    local_3d8 = (undefined1  [16])0x0;
    local_3c8 = (undefined1  [16])0x0;
    local_3b8 = SUB1613((undefined1  [16])0x0,0);
    uStack_3ab = 0;
    iStack_3a8 = 0;
    bStack_3a4 = false;
    lVar11 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar11 != 0) {
      lVar9 = lVar11 << 7;
      do {
        pnVar1 = (this->vec).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar1[-1].m_backend.data + lVar9);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(base->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9);
        local_650 = 0x1c00000000;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = SUB1613((undefined1  [16])0x0,0);
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if (pcVar17 == (cpp_dec_float<200U,_int,_void> *)local_6c8) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,pcVar10);
          if (local_6c8._0_4_ != 0 || (fpclass_type)local_650 != cpp_dec_float_finite) {
            bStack_654 = (bool)(bStack_654 ^ 1);
          }
        }
        else {
          if (pcVar10 != (cpp_dec_float<200U,_int,_void> *)local_6c8) {
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
            }
            iStack_658 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70);
            bStack_654 = *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74);
            local_650 = *(long *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,pcVar17);
        }
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        puVar18 = (uint *)local_598;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar18 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        }
        iStack_528 = iStack_658;
        bStack_524 = bStack_654;
        local_520 = local_650;
        pnVar1 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .up.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)&pnVar1[-1].m_backend.data + lVar9);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(this->vec).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9);
        local_650 = 0x1c00000000;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = SUB1613((undefined1  [16])0x0,0);
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if (pcVar17 == (cpp_dec_float<200U,_int,_void> *)local_6c8) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,pcVar10);
          if (local_6c8._0_4_ != 0 || (fpclass_type)local_650 != cpp_dec_float_finite) {
            bStack_654 = (bool)(bStack_654 ^ 1);
          }
        }
        else {
          if (pcVar10 != (cpp_dec_float<200U,_int,_void> *)local_6c8) {
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
            }
            iStack_658 = *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70);
            bStack_654 = *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74);
            local_650 = *(long *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78);
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,pcVar17);
        }
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        puVar18 = (uint *)local_418;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          *puVar18 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        }
        iStack_3a8 = iStack_658;
        bStack_3a4 = bStack_654;
        local_3a0 = local_650;
        if (((int)local_650 == 2 || (fpclass_type)local_520 == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_598,
                               (cpp_dec_float<200U,_int,_void> *)local_418), local_5b8 = local_520,
           iVar8 = iStack_528, -1 < iVar7)) {
          local_5b8 = local_3a0;
          iVar8 = iStack_3a8;
          uVar5 = local_418._0_4_;
          puVar18 = (uint *)(local_418 + 4);
          pcVar10 = &local_298;
          for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          bVar14 = ((int)local_3a0 != 0 || local_418._0_4_ != 0) ^ bStack_3a4;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9);
          local_5c0._0_4_ = cpp_dec_float_finite;
          local_5c0._4_4_ = 0x1c;
          local_638 = (undefined1  [16])0x0;
          local_628 = (undefined1  [16])0x0;
          local_618 = (undefined1  [16])0x0;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = SUB1613((undefined1  [16])0x0,0);
          uStack_5cb = 0;
          iStack_5c8 = 0;
          bStack_5c4 = false;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_498;
          if (pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_638) {
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_638;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
            }
            iStack_5c8 = iStack_428;
            bStack_5c4 = bStack_424;
            local_5c0._0_4_ = (fpclass_type)local_420;
            local_5c0._4_4_ = local_420._4_4_;
            pcVar10 = pcVar17;
          }
          uStack_5b0 = 0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_638,pcVar10);
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = SUB1613((undefined1  [16])0x0,0);
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          local_6c8._4_12_ = SUB1612((undefined1  [16])0x0,4);
          local_6c8._0_4_ = uVar5;
          pcVar10 = &local_298;
          puVar18 = (uint *)(local_6c8 + 4);
          for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar24 * -2 + 1) * 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          iStack_658 = iVar8;
          local_650 = local_5b8;
          bStack_654 = (bool)bVar14;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                     (cpp_dec_float<200U,_int,_void> *)local_638);
          pnVar1 = (local_648->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).colWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          puVar18 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar9);
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70) = iStack_658;
          *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74) = bStack_654;
          *(long *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78) = local_650;
          bVar6 = true;
        }
        else {
          uVar5 = local_598._0_4_;
          puVar18 = (uint *)(local_598 + 4);
          pcVar10 = &local_298;
          for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar24 * -2 + 1) * 4);
          }
          bVar14 = ((int)local_520 != 0 || local_598._0_4_ != 0) ^ bStack_524;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                    ((long)&(base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + lVar9);
          local_5c0._0_4_ = cpp_dec_float_finite;
          local_5c0._4_4_ = 0x1c;
          local_638 = (undefined1  [16])0x0;
          local_628 = (undefined1  [16])0x0;
          local_618 = (undefined1  [16])0x0;
          local_608 = (undefined1  [16])0x0;
          local_5f8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_5d8 = SUB1613((undefined1  [16])0x0,0);
          uStack_5cb = 0;
          iStack_5c8 = 0;
          bStack_5c4 = false;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_498;
          if (pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_638) {
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_638;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar19->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
            }
            iStack_5c8 = iStack_428;
            bStack_5c4 = bStack_424;
            local_5c0._0_4_ = (fpclass_type)local_420;
            local_5c0._4_4_ = local_420._4_4_;
            pcVar10 = pcVar17;
          }
          uStack_5b0 = 0;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_638,pcVar10);
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = SUB1613((undefined1  [16])0x0,0);
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          local_6c8._4_12_ = SUB1612((undefined1  [16])0x0,4);
          local_6c8._0_4_ = uVar5;
          pcVar10 = &local_298;
          puVar18 = (uint *)(local_6c8 + 4);
          for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar10 + ((ulong)bVar24 * -2 + 1) * 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          iStack_658 = iVar8;
          local_650 = local_5b8;
          bStack_654 = (bool)bVar14;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                     (cpp_dec_float<200U,_int,_void> *)local_638);
          pnVar1 = (local_648->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).colWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          puVar18 = (uint *)((long)&pnVar1[-1].m_backend.data + lVar9);
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          *(int *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x70) = iStack_658;
          *(bool *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x74) = bStack_654;
          *(long *)((long)&pnVar1[-1].m_backend.data + lVar9 + 0x78) = local_650;
          bVar6 = false;
        }
        (local_648->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).colUp.data[lVar11 + -1] = bVar6;
        lVar11 = lVar11 + -1;
        this = local_648;
        lVar9 = lVar9 + -0x80;
      } while (lVar11 != 0);
    }
    lVar11 = (long)(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum;
    if (lVar11 != 0) {
      do {
        pIVar3 = (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem +
                 (base->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thekey[lVar11 + -1].idx;
        local_650 = 0x1c00000000;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = SUB1613((undefined1  [16])0x0,0);
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        lVar9 = (long)(pIVar3->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused;
        if (0 < lVar9) {
          lVar12 = lVar9 + 1;
          lVar9 = lVar9 * 0x84;
          do {
            pNVar4 = (pIVar3->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)&pNVar4[-1].val.m_backend.data + lVar9);
            pcVar19 = &(local_648->vec).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&pNVar4[-1].val + 1) + lVar9)].m_backend;
            local_5c0._0_4_ = cpp_dec_float_finite;
            local_5c0._4_4_ = 0x1c;
            local_638 = (undefined1  [16])0x0;
            local_628 = (undefined1  [16])0x0;
            local_618 = (undefined1  [16])0x0;
            local_608 = (undefined1  [16])0x0;
            local_5f8 = (undefined1  [16])0x0;
            local_5e8 = (undefined1  [16])0x0;
            local_5d8 = SUB1613((undefined1  [16])0x0,0);
            uStack_5cb = 0;
            iStack_5c8 = 0;
            bStack_5c4 = false;
            pcVar10 = pcVar19;
            if ((pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_638) &&
               (pcVar10 = pcVar17, (cpp_dec_float<200U,_int,_void> *)local_638 != pcVar19)) {
              pcVar17 = pcVar19;
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_638;
              for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar22->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4)
                ;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar24 * -8 + 4)
                ;
              }
              iStack_5c8 = pcVar19->exp;
              bStack_5c4 = pcVar19->neg;
              local_5c0._0_4_ = pcVar19->fpclass;
              local_5c0._4_4_ = pcVar19->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                      ((cpp_dec_float<200U,_int,_void> *)local_638,pcVar10);
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                      ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                       (cpp_dec_float<200U,_int,_void> *)local_638);
            lVar12 = lVar12 + -1;
            lVar9 = lVar9 + -0x84;
          } while (1 < lVar12);
        }
        lVar9 = local_650;
        bVar6 = bStack_654;
        iVar8 = iStack_658;
        lVar11 = lVar11 + -1;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_418;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
        }
        iStack_3a8 = iStack_658;
        bStack_3a4 = bStack_654;
        local_3a0 = local_650;
        local_5b8 = lVar11 * 0x80;
        pcVar10 = &(base->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar11].m_backend;
        local_650 = 0x1c00000000;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = SUB1613((undefined1  [16])0x0,0);
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_6c8 == pcVar10) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                     (cpp_dec_float<200U,_int,_void> *)local_418);
          if (local_6c8._0_4_ != 0 || (fpclass_type)local_650 != cpp_dec_float_finite) {
            bStack_654 = (bool)(bStack_654 ^ 1);
          }
        }
        else {
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_418;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
          }
          iStack_658 = iVar8;
          bStack_654 = bVar6;
          local_650 = lVar9;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,pcVar10);
        }
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        puVar18 = (uint *)local_598;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
        }
        iStack_528 = iStack_658;
        bStack_524 = bStack_654;
        local_520 = local_650;
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                  ((long)&(((base->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + local_5b8)
        ;
        local_650 = 0x1c00000000;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = (undefined1  [16])0x0;
        local_688 = (undefined1  [16])0x0;
        local_678 = (undefined1  [16])0x0;
        local_668 = SUB1613((undefined1  [16])0x0,0);
        uStack_65b = 0;
        iStack_658 = 0;
        bStack_654 = false;
        if ((cpp_dec_float<200U,_int,_void> *)local_6c8 != pcVar10) {
          pcVar17 = pcVar10;
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar19->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
            pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar24 * -8 + 4);
          }
          iStack_658 = pcVar10->exp;
          bStack_654 = pcVar10->neg;
          local_650._0_4_ = pcVar10->fpclass;
          local_650._4_4_ = pcVar10->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                   (cpp_dec_float<200U,_int,_void> *)local_418);
        pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_418;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
        }
        iStack_3a8 = iStack_658;
        bStack_3a4 = bStack_654;
        local_3a0 = local_650;
        if (((int)local_650 == 2 || (fpclass_type)local_520 == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_598,
                               (cpp_dec_float<200U,_int,_void> *)local_418), -1 < iVar8)) {
          uVar5 = local_418._0_4_;
          puVar16 = (undefined4 *)(local_418 + 4);
          puVar21 = local_10c;
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar21 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          local_63c = iStack_3a8;
          local_5a8 = local_3a0;
          bVar14 = (local_418._0_4_ != 0 || (int)local_3a0 != 0) ^ bStack_3a4;
          local_320._0_4_ = cpp_dec_float_finite;
          local_320._4_4_ = 0x1c;
          local_398 = (undefined1  [16])0x0;
          local_388 = (undefined1  [16])0x0;
          local_378 = (undefined1  [16])0x0;
          local_368 = (undefined1  [16])0x0;
          local_358 = (undefined1  [16])0x0;
          local_348 = (undefined1  [16])0x0;
          local_338 = SUB1613((undefined1  [16])0x0,0);
          uStack_32b = 0;
          iStack_328 = 0;
          bStack_324 = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                     (long)(pIVar3->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          puVar18 = (uint *)local_318;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_398;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          iStack_328 = iStack_2a8;
          bStack_324 = bStack_2a4;
          local_320._0_4_ = (fpclass_type)local_2a0;
          local_320._4_4_ = local_2a0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_398,
                     (cpp_dec_float<200U,_int,_void> *)local_6c8);
          base = local_5a0;
          local_4a0._0_4_ = cpp_dec_float_finite;
          local_4a0._4_4_ = 0x1c;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8 = (undefined1  [16])0x0;
          local_4d8 = (undefined1  [16])0x0;
          local_4c8 = (undefined1  [16])0x0;
          local_4b8 = SUB1613((undefined1  [16])0x0,0);
          uStack_4ab = 0;
          iStack_4a8 = 0;
          bStack_4a4 = false;
          local_518._4_12_ = SUB1612((undefined1  [16])0x0,4);
          local_518._0_4_ = uVar5;
          puVar16 = local_10c;
          puVar21 = (undefined4 *)(local_518 + 4);
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar21 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          iStack_4a8 = local_63c;
          local_4a0 = local_5a8;
          bStack_4a4 = (bool)bVar14;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_518,
                     (cpp_dec_float<200U,_int,_void> *)local_398);
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = SUB1613((undefined1  [16])0x0,0);
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          lVar9 = (long)(pIVar3->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
          if (0 < lVar9) {
            lVar12 = lVar9 + 1;
            lVar9 = lVar9 * 0x84;
            do {
              pNVar4 = (pIVar3->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&pNVar4[-1].val.m_backend.data + lVar9);
              pcVar19 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4[-1].val + 1) + lVar9)].m_backend;
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x1c;
              local_638 = (undefined1  [16])0x0;
              local_628 = (undefined1  [16])0x0;
              local_618 = (undefined1  [16])0x0;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = SUB1613((undefined1  [16])0x0,0);
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              pcVar10 = pcVar19;
              if ((pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_638) &&
                 (pcVar10 = pcVar17, (cpp_dec_float<200U,_int,_void> *)local_638 != pcVar19)) {
                pcVar17 = pcVar19;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_638;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                  pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar17 + (ulong)bVar24 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar24 * -8 + 4);
                }
                iStack_5c8 = pcVar19->exp;
                bStack_5c4 = pcVar19->neg;
                local_5c0._0_4_ = pcVar19->fpclass;
                local_5c0._4_4_ = pcVar19->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_638,pcVar10);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                         (cpp_dec_float<200U,_int,_void> *)local_638);
              lVar12 = lVar12 + -1;
              lVar9 = lVar9 + -0x84;
            } while (1 < lVar12);
          }
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_638;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
          }
          iStack_5c8 = iStack_658;
          bStack_5c4 = bStack_654;
          local_5c0._0_4_ = (fpclass_type)local_650;
          local_5c0._4_4_ = local_650._4_4_;
          local_18c.fpclass = cpp_dec_float_finite;
          local_18c.prec_elem = 0x1c;
          local_18c.neg = false;
          local_18c.exp = 0;
          puVar18 = (uint *)local_498;
          pcVar10 = &local_18c;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          local_18c.exp = iStack_428;
          local_18c.neg = bStack_424;
          local_18c.fpclass = (fpclass_type)local_420;
          local_18c.prec_elem = local_420._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_18c,(cpp_dec_float<200U,_int,_void> *)local_638);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x1c;
          local_298.exp = 0;
          local_298.neg = false;
          puVar18 = (uint *)local_518;
          pcVar10 = &local_298;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          local_298.exp = iStack_4a8;
          local_298.neg = bStack_4a4;
          local_298.fpclass = (undefined4)local_4a0;
          local_298.prec_elem = local_4a0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_298,&local_18c);
          pnVar1 = (local_648->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).rowWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar10 = &local_298;
          puVar18 = (uint *)((long)&(pnVar1->m_backend).data + local_5b8);
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x70) = local_298.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x74) = local_298.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x78) = local_298._120_8_;
          bVar6 = true;
        }
        else {
          uVar5 = local_598._0_4_;
          puVar16 = (undefined4 *)(local_598 + 4);
          puVar21 = local_10c;
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar21 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          local_63c = iStack_528;
          local_5a8 = local_520;
          bVar14 = (local_598._0_4_ != 0 || (int)local_520 != 0) ^ bStack_524;
          local_320._0_4_ = cpp_dec_float_finite;
          local_320._4_4_ = 0x1c;
          local_398 = (undefined1  [16])0x0;
          local_388 = (undefined1  [16])0x0;
          local_378 = (undefined1  [16])0x0;
          local_368 = (undefined1  [16])0x0;
          local_358 = (undefined1  [16])0x0;
          local_348 = (undefined1  [16])0x0;
          local_338 = SUB1613((undefined1  [16])0x0,0);
          uStack_32b = 0;
          iStack_328 = 0;
          bStack_324 = false;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                     (long)(pIVar3->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused,(type *)0x0);
          puVar18 = (uint *)local_318;
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_398;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          iStack_328 = iStack_2a8;
          bStack_324 = bStack_2a4;
          local_320._0_4_ = (fpclass_type)local_2a0;
          local_320._4_4_ = local_2a0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_398,
                     (cpp_dec_float<200U,_int,_void> *)local_6c8);
          local_4a0._0_4_ = cpp_dec_float_finite;
          local_4a0._4_4_ = 0x1c;
          local_508 = (undefined1  [16])0x0;
          local_4f8 = (undefined1  [16])0x0;
          local_4e8 = (undefined1  [16])0x0;
          local_4d8 = (undefined1  [16])0x0;
          local_4c8 = (undefined1  [16])0x0;
          local_4b8 = SUB1613((undefined1  [16])0x0,0);
          uStack_4ab = 0;
          iStack_4a8 = 0;
          bStack_4a4 = false;
          local_518._4_12_ = SUB1612((undefined1  [16])0x0,4);
          local_518._0_4_ = uVar5;
          puVar16 = local_10c;
          puVar21 = (undefined4 *)(local_518 + 4);
          for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar21 = *puVar16;
            puVar16 = puVar16 + (ulong)bVar24 * -2 + 1;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
          }
          iStack_4a8 = local_63c;
          local_4a0 = local_5a8;
          bStack_4a4 = (bool)bVar14;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    ((cpp_dec_float<200U,_int,_void> *)local_518,
                     (cpp_dec_float<200U,_int,_void> *)local_398);
          local_650._0_4_ = cpp_dec_float_finite;
          local_650._4_4_ = 0x1c;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = (undefined1  [16])0x0;
          local_688 = (undefined1  [16])0x0;
          local_678 = (undefined1  [16])0x0;
          local_668 = SUB1613((undefined1  [16])0x0,0);
          uStack_65b = 0;
          iStack_658 = 0;
          bStack_654 = false;
          lVar9 = (long)(pIVar3->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused;
          if (0 < lVar9) {
            lVar12 = lVar9 + 1;
            lVar9 = lVar9 * 0x84;
            do {
              pNVar4 = (pIVar3->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem;
              pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)&pNVar4[-1].val.m_backend.data + lVar9);
              pcVar19 = &(base->
                         super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .object.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&pNVar4[-1].val + 1) + lVar9)].m_backend;
              local_5c0._0_4_ = cpp_dec_float_finite;
              local_5c0._4_4_ = 0x1c;
              local_638 = (undefined1  [16])0x0;
              local_628 = (undefined1  [16])0x0;
              local_618 = (undefined1  [16])0x0;
              local_608 = (undefined1  [16])0x0;
              local_5f8 = (undefined1  [16])0x0;
              local_5e8 = (undefined1  [16])0x0;
              local_5d8 = SUB1613((undefined1  [16])0x0,0);
              uStack_5cb = 0;
              iStack_5c8 = 0;
              bStack_5c4 = false;
              pcVar10 = pcVar19;
              if ((pcVar17 != (cpp_dec_float<200U,_int,_void> *)local_638) &&
                 (pcVar10 = pcVar17, (cpp_dec_float<200U,_int,_void> *)local_638 != pcVar19)) {
                pcVar17 = pcVar19;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_638;
                for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar17->data)._M_elems[0];
                  pcVar17 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar17 + (ulong)bVar24 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar24 * -8 + 4);
                }
                iStack_5c8 = pcVar19->exp;
                bStack_5c4 = pcVar19->neg;
                local_5c0._0_4_ = pcVar19->fpclass;
                local_5c0._4_4_ = pcVar19->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_638,pcVar10);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_6c8,
                         (cpp_dec_float<200U,_int,_void> *)local_638);
              lVar12 = lVar12 + -1;
              lVar9 = lVar9 + -0x84;
            } while (1 < lVar12);
          }
          pcVar10 = (cpp_dec_float<200U,_int,_void> *)local_6c8;
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)local_638;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar17->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar24 * -8 + 4);
          }
          iStack_5c8 = iStack_658;
          bStack_5c4 = bStack_654;
          local_5c0._0_4_ = (fpclass_type)local_650;
          local_5c0._4_4_ = local_650._4_4_;
          local_18c.fpclass = cpp_dec_float_finite;
          local_18c.prec_elem = 0x1c;
          bVar6 = false;
          local_18c.neg = false;
          local_18c.exp = 0;
          puVar18 = (uint *)local_498;
          pcVar10 = &local_18c;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          local_18c.exp = iStack_428;
          local_18c.neg = bStack_424;
          local_18c.fpclass = (fpclass_type)local_420;
          local_18c.prec_elem = local_420._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_18c,(cpp_dec_float<200U,_int,_void> *)local_638);
          local_298.fpclass = cpp_dec_float_finite;
          local_298.prec_elem = 0x1c;
          local_298.exp = 0;
          local_298.neg = false;
          puVar18 = (uint *)local_518;
          pcVar10 = &local_298;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pcVar10->data)._M_elems[0] = *puVar18;
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
          }
          local_298.exp = iStack_4a8;
          local_298.neg = bStack_4a4;
          local_298.fpclass = (undefined4)local_4a0;
          local_298.prec_elem = local_4a0._4_4_;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_298,&local_18c);
          pnVar1 = (local_648->
                   super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).rowWeight.data.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar10 = &local_298;
          puVar18 = (uint *)((long)&(pnVar1->m_backend).data + local_5b8);
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar18 = (pcVar10->data)._M_elems[0];
            pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar24 * -8 + 4);
            puVar18 = puVar18 + (ulong)bVar24 * -2 + 1;
          }
          *(int *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x70) = local_298.exp;
          *(bool *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x74) = local_298.neg;
          *(undefined8 *)((long)&(pnVar1->m_backend).data + local_5b8 + 0x78) = local_298._120_8_;
        }
        (local_648->
        super_SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).rowRight.data[lVar11] = bVar6;
      } while (lVar11 != 0);
    }
  }
  return;
}

Assistant:

void SPxVectorST<R>::setupWeights(SPxSolverBase<R>& base)
{
   if(state == PVEC)
   {
      if(vec.dim() != base.nCols())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      const VectorBase<R>& obj = base.maxObj();
      R eps = base.epsilon();
      R bias = 10000 * eps;
      R x, y;
      int i;

      SPxOut::debug(this, "DVECST01 colWeight[]: ");

      for(i = base.nCols(); i--;)
      {
         x = vec[i] - base.SPxLPBase<R>::lower(i);
         y = base.SPxLPBase<R>::upper(i) - vec[i];

         if(x < y)
         {
            this->colWeight[i] = -x - bias * obj[i];
            this->colUp[i] = 0;
         }
         else
         {
            this->colWeight[i] = -y + bias * obj[i];
            this->colUp[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->colWeight[i]);
      }

      SPxOut::debug(this, "\n \n");

      SPxOut::debug(this, "DVECST02 rowWeight[]: ");

      for(i = base.nRows(); i--;)
      {
         const SVectorBase<R>& row = base.rowVector(i);
         y = vec * row;
         x = (y - base.lhs(i));
         y = (base.rhs(i) - y);

         if(x < y)
         {
            this->rowWeight[i] = -x - eps * row.size() - bias * (obj * row);
            this->rowRight[i] = 0;
         }
         else
         {
            this->rowWeight[i] = -y - eps * row.size() + bias * (obj * row);
            this->rowRight[i] = 1;
         }

         SPxOut::debug(this, "{} ", this->rowWeight[i]);
      }

      SPxOut::debug(this, "\n");
   }

   else if(state == DVEC)
   {
      if(vec.dim() != base.nRows())
      {
         SPxWeightST<R>::setupWeights(base);
         return;
      }

      R x, y, len;
      int i, j;

      for(i = base.nRows(); i--;)
         this->rowWeight[i] += spxAbs(vec[i]);

      for(i = base.nCols(); i--;)
      {
         const SVectorBase<R>& col = base.colVector(i);

         for(y = len = 0, j = col.size(); j--;)
         {
            x = col.value(j);
            y += vec[col.index(j)] * x;
            len += x * x;
         }

         if(len > 0)
            this->colWeight[i] += spxAbs(y / len - base.maxObj(i));
      }
   }
   else
      SPxWeightST<R>::setupWeights(base);
}